

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

int read_file(char *filename,int merge)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  int iVar3;
  Fl_Type **ppFVar4;
  
  read_version = 0.0;
  iVar3 = open_read(filename);
  if (iVar3 != 0) {
    if (merge == 0) {
      delete_all(0);
    }
    else {
      deselect();
    }
    read_children(Fl_Type::current,merge);
    Fl_Type::current = (Fl_Type *)0x0;
    ppFVar4 = &Fl_Type::first;
    while (pFVar1 = *ppFVar4, pFVar1 != (Fl_Type *)0x0) {
      iVar3 = (*pFVar1->_vptr_Fl_Type[0x1f])(pFVar1);
      if (iVar3 != 0) {
        (*pFVar1->_vptr_Fl_Type[8])(pFVar1,0,0);
      }
      ppFVar4 = &pFVar1->next;
    }
    ppFVar4 = &Fl_Type::first;
    while ((pFVar1 = *ppFVar4, pFVar2 = Fl_Type::current, pFVar1 != (Fl_Type *)0x0 &&
           (pFVar2 = pFVar1, pFVar1->selected == '\0'))) {
      ppFVar4 = &pFVar1->next;
    }
    Fl_Type::current = pFVar2;
    selection_changed(Fl_Type::current);
    iVar3 = close_read();
    return iVar3;
  }
  return 0;
}

Assistant:

int read_file(const char *filename, int merge) {
  Fl_Type *o;
  read_version = 0.0;
  if (!open_read(filename)) return 0;
  if (merge) deselect(); else    delete_all();
  read_children(Fl_Type::current, merge);
  Fl_Type::current = 0;
  // Force menu items to be rebuilt...
  for (o = Fl_Type::first; o; o = o->next)
    if (o->is_menu_button()) o->add_child(0,0);
  for (o = Fl_Type::first; o; o = o->next)
    if (o->selected) {Fl_Type::current = o; break;}
  selection_changed(Fl_Type::current);
  return close_read();
}